

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall backward::Colorize::set_color(Colorize *this,type ccode)

{
  ostream *poVar1;
  
  if (this->_enabled == true) {
    poVar1 = (ostream *)this->_os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[",2);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,ccode);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
    this->_reset = ccode != reset;
  }
  return;
}

Assistant:

void set_color(Color::type ccode) {
    if (!_enabled)
      return;

    // I assume that the terminal can handle basic colors. Seriously I
    // don't want to deal with all the termcap shit.
    _os << "\033[" << static_cast<int>(ccode) << "m";
    _reset = (ccode != Color::reset);
  }